

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_block<unsigned_char_*,_128U> *bucket,
          size_t depth)

{
  uint16_t uVar1;
  uint uVar2;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *this_00;
  uchar *ptr;
  vector_block<unsigned_char_*,_128U> *pvVar3;
  ulong index;
  uint j;
  long lVar4;
  uchar **t;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  
  this_00 = (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = (*(int *)&(bucket->_index_block).
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(bucket->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x10 - bucket->_left_in_block;
  index = 0;
  do {
    if ((uVar2 & 0xffffffc0) <= index) {
      while( true ) {
        if (uVar2 <= index) {
          return this_00;
        }
        strings._M_elems[0] = vector_block<unsigned_char_*,_128U>::operator[](bucket,index);
        uVar1 = get_char<unsigned_short>(strings._M_elems[0],depth);
        pvVar3 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                           (this_00,(uint)uVar1);
        if (pvVar3 == (vector_block<unsigned_char_*,_128U> *)0x0) break;
        vector_block<unsigned_char_*,_128U>::push_back(pvVar3,strings._M_elems);
        index = index + 1;
      }
      __assert_fail("sub_bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0x80,
                    "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_block<unsigned char *, 128>]"
                   );
    }
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      ptr = vector_block<unsigned_char_*,_128U>::operator[](bucket,index + lVar4);
      strings._M_elems[lVar4] = ptr;
      uVar1 = get_char<unsigned_short>(ptr,depth);
      cache._M_elems[lVar4] = uVar1;
    }
    t = strings._M_elems;
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      pvVar3 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                         (this_00,(uint)cache._M_elems[lVar4]);
      if (pvVar3 == (vector_block<unsigned_char_*,_128U> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x78,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_block<unsigned char *, 128>]"
                     );
      }
      vector_block<unsigned_char_*,_128U>::push_back(pvVar3,t);
      t = t + 1;
    }
    index = index + 0x40;
  } while( true );
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}